

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-bignum.cc
# Opt level: O0

void TestAssignPowerUInt16(void)

{
  char buffer [1024];
  Bignum bignum;
  undefined7 in_stack_fffffffffffff9f8;
  undefined1 in_stack_fffffffffffff9ff;
  char *in_stack_fffffffffffffa00;
  undefined4 in_stack_fffffffffffffa08;
  int in_stack_fffffffffffffa0c;
  char *in_stack_fffffffffffffa10;
  int in_stack_fffffffffffffa1c;
  char *in_stack_fffffffffffffa20;
  int in_stack_fffffffffffffa2c;
  char *in_stack_fffffffffffffa30;
  Bignum *in_stack_fffffffffffffa38;
  int in_stack_fffffffffffffa48;
  uint16_t in_stack_fffffffffffffa4e;
  Bignum *in_stack_fffffffffffffa50;
  Bignum local_204;
  
  double_conversion::Bignum::Bignum(&local_204);
  double_conversion::Bignum::AssignPowerUInt16
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4e,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  CheckHelper(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,in_stack_fffffffffffffa00,
              (bool)in_stack_fffffffffffff9ff);
  CheckEqualsHelper(in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,in_stack_fffffffffffffa10,
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  double_conversion::Bignum::AssignPowerUInt16
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4e,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  CheckHelper(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,in_stack_fffffffffffffa00,
              (bool)in_stack_fffffffffffff9ff);
  CheckEqualsHelper(in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,in_stack_fffffffffffffa10,
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  double_conversion::Bignum::AssignPowerUInt16
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4e,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  CheckHelper(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,in_stack_fffffffffffffa00,
              (bool)in_stack_fffffffffffff9ff);
  CheckEqualsHelper(in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,in_stack_fffffffffffffa10,
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  double_conversion::Bignum::AssignPowerUInt16
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4e,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  CheckHelper(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,in_stack_fffffffffffffa00,
              (bool)in_stack_fffffffffffff9ff);
  CheckEqualsHelper(in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,in_stack_fffffffffffffa10,
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  double_conversion::Bignum::AssignPowerUInt16
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4e,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  CheckHelper(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,in_stack_fffffffffffffa00,
              (bool)in_stack_fffffffffffff9ff);
  CheckEqualsHelper(in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,in_stack_fffffffffffffa10,
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  double_conversion::Bignum::AssignPowerUInt16
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4e,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  CheckHelper(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,in_stack_fffffffffffffa00,
              (bool)in_stack_fffffffffffff9ff);
  CheckEqualsHelper(in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,in_stack_fffffffffffffa10,
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  double_conversion::Bignum::AssignPowerUInt16
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4e,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  CheckHelper(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,in_stack_fffffffffffffa00,
              (bool)in_stack_fffffffffffff9ff);
  CheckEqualsHelper(in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,in_stack_fffffffffffffa10,
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  double_conversion::Bignum::AssignPowerUInt16
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4e,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  CheckHelper(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,in_stack_fffffffffffffa00,
              (bool)in_stack_fffffffffffff9ff);
  CheckEqualsHelper(in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,in_stack_fffffffffffffa10,
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  double_conversion::Bignum::AssignPowerUInt16
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4e,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  CheckHelper(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,in_stack_fffffffffffffa00,
              (bool)in_stack_fffffffffffff9ff);
  CheckEqualsHelper(in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,in_stack_fffffffffffffa10,
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  double_conversion::Bignum::AssignPowerUInt16
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4e,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  CheckHelper(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,in_stack_fffffffffffffa00,
              (bool)in_stack_fffffffffffff9ff);
  CheckEqualsHelper(in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,in_stack_fffffffffffffa10,
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  double_conversion::Bignum::AssignPowerUInt16
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4e,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  CheckHelper(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,in_stack_fffffffffffffa00,
              (bool)in_stack_fffffffffffff9ff);
  CheckEqualsHelper(in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,in_stack_fffffffffffffa10,
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  double_conversion::Bignum::AssignPowerUInt16
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4e,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  CheckHelper(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,in_stack_fffffffffffffa00,
              (bool)in_stack_fffffffffffff9ff);
  CheckEqualsHelper(in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,in_stack_fffffffffffffa10,
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  double_conversion::Bignum::AssignPowerUInt16
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4e,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  CheckHelper(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,in_stack_fffffffffffffa00,
              (bool)in_stack_fffffffffffff9ff);
  CheckEqualsHelper(in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,in_stack_fffffffffffffa10,
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  double_conversion::Bignum::AssignPowerUInt16
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4e,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  CheckHelper(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,in_stack_fffffffffffffa00,
              (bool)in_stack_fffffffffffff9ff);
  CheckEqualsHelper(in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,in_stack_fffffffffffffa10,
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  double_conversion::Bignum::AssignPowerUInt16
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4e,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  CheckHelper(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,in_stack_fffffffffffffa00,
              (bool)in_stack_fffffffffffff9ff);
  CheckEqualsHelper(in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,in_stack_fffffffffffffa10,
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  double_conversion::Bignum::AssignPowerUInt16
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4e,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  CheckHelper(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,in_stack_fffffffffffffa00,
              (bool)in_stack_fffffffffffff9ff);
  CheckEqualsHelper(in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,in_stack_fffffffffffffa10,
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  double_conversion::Bignum::AssignPowerUInt16
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4e,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  CheckHelper(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,in_stack_fffffffffffffa00,
              (bool)in_stack_fffffffffffff9ff);
  CheckEqualsHelper(in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,in_stack_fffffffffffffa10,
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  double_conversion::Bignum::AssignPowerUInt16
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4e,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  CheckHelper(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,in_stack_fffffffffffffa00,
              (bool)in_stack_fffffffffffff9ff);
  CheckEqualsHelper(in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,in_stack_fffffffffffffa10,
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  double_conversion::Bignum::AssignPowerUInt16
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4e,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  CheckHelper(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,in_stack_fffffffffffffa00,
              (bool)in_stack_fffffffffffff9ff);
  CheckEqualsHelper(in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,in_stack_fffffffffffffa10,
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  double_conversion::Bignum::AssignPowerUInt16
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4e,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  CheckHelper(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,in_stack_fffffffffffffa00,
              (bool)in_stack_fffffffffffff9ff);
  CheckEqualsHelper(in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,in_stack_fffffffffffffa10,
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  double_conversion::Bignum::AssignPowerUInt16
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4e,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  CheckHelper(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,in_stack_fffffffffffffa00,
              (bool)in_stack_fffffffffffff9ff);
  CheckEqualsHelper(in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,in_stack_fffffffffffffa10,
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  double_conversion::Bignum::AssignPowerUInt16
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4e,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  CheckHelper(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,in_stack_fffffffffffffa00,
              (bool)in_stack_fffffffffffff9ff);
  CheckEqualsHelper(in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,in_stack_fffffffffffffa10,
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  double_conversion::Bignum::AssignPowerUInt16
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4e,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  CheckHelper(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,in_stack_fffffffffffffa00,
              (bool)in_stack_fffffffffffff9ff);
  CheckEqualsHelper(in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,in_stack_fffffffffffffa10,
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  double_conversion::Bignum::AssignPowerUInt16
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4e,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  CheckHelper(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,in_stack_fffffffffffffa00,
              (bool)in_stack_fffffffffffff9ff);
  CheckEqualsHelper(in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,in_stack_fffffffffffffa10,
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  double_conversion::Bignum::AssignPowerUInt16
            (in_stack_fffffffffffffa50,in_stack_fffffffffffffa4e,in_stack_fffffffffffffa48);
  double_conversion::Bignum::ToHexString
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30,in_stack_fffffffffffffa2c);
  CheckHelper(in_stack_fffffffffffffa10,in_stack_fffffffffffffa0c,in_stack_fffffffffffffa00,
              (bool)in_stack_fffffffffffff9ff);
  CheckEqualsHelper(in_stack_fffffffffffffa20,in_stack_fffffffffffffa1c,in_stack_fffffffffffffa10,
                    (char *)CONCAT44(in_stack_fffffffffffffa0c,in_stack_fffffffffffffa08),
                    in_stack_fffffffffffffa00,
                    (char *)CONCAT17(in_stack_fffffffffffff9ff,in_stack_fffffffffffff9f8));
  return;
}

Assistant:

TEST(AssignPowerUInt16) {
  Bignum bignum;
  char buffer[kBufferSize];

  bignum.AssignPowerUInt16(1, 0);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1", buffer);

  bignum.AssignPowerUInt16(1, 1);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1", buffer);

  bignum.AssignPowerUInt16(1, 2);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1", buffer);

  bignum.AssignPowerUInt16(2, 0);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1", buffer);

  bignum.AssignPowerUInt16(2, 1);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("2", buffer);

  bignum.AssignPowerUInt16(2, 2);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("4", buffer);

  bignum.AssignPowerUInt16(16, 1);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10", buffer);

  bignum.AssignPowerUInt16(16, 2);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("100", buffer);

  bignum.AssignPowerUInt16(16, 5);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("100000", buffer);

  bignum.AssignPowerUInt16(16, 8);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("100000000", buffer);

  bignum.AssignPowerUInt16(16, 16);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000000000", buffer);

  bignum.AssignPowerUInt16(16, 30);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1000000000000000000000000000000", buffer);

  bignum.AssignPowerUInt16(10, 0);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1", buffer);

  bignum.AssignPowerUInt16(10, 1);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("A", buffer);

  bignum.AssignPowerUInt16(10, 2);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("64", buffer);

  bignum.AssignPowerUInt16(10, 5);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("186A0", buffer);

  bignum.AssignPowerUInt16(10, 8);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("5F5E100", buffer);

  bignum.AssignPowerUInt16(10, 16);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("2386F26FC10000", buffer);

  bignum.AssignPowerUInt16(10, 30);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("C9F2C9CD04674EDEA40000000", buffer);

  bignum.AssignPowerUInt16(10, 31);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("7E37BE2022C0914B2680000000", buffer);

  bignum.AssignPowerUInt16(2, 0);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1", buffer);

  bignum.AssignPowerUInt16(2, 100);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("10000000000000000000000000", buffer);

  bignum.AssignPowerUInt16(17, 0);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1", buffer);

  bignum.AssignPowerUInt16(17, 99);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("1942BB9853FAD924A3D4DD92B89B940E0207BEF05DB9C26BC1B757"
           "80BE0C5A2C2990E02A681224F34ED68558CE4C6E33760931",
           buffer);

  bignum.AssignPowerUInt16(0xFFFF, 99);
  CHECK(bignum.ToHexString(buffer, kBufferSize));
  CHECK_EQ("FF9D12F09B886C54E77E7439C7D2DED2D34F669654C0C2B6B8C288250"
           "5A2211D0E3DC9A61831349EAE674B11D56E3049D7BD79DAAD6C9FA2BA"
           "528E3A794299F2EE9146A324DAFE3E88967A0358233B543E233E575B9"
           "DD4E3AA7942146426C328FF55BFD5C45E0901B1629260AF9AE2F310C5"
           "50959FAF305C30116D537D80CF6EBDBC15C5694062AF1AC3D956D0A41"
           "B7E1B79FF11E21D83387A1CE1F5882B31E4B5D8DE415BDBE6854466DF"
           "343362267A7E8833119D31D02E18DB5B0E8F6A64B0ED0D0062FFFF",
           buffer);
}